

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  pointer pMVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 in_EAX;
  int iVar10;
  uint uVar11;
  uint uVar13;
  undefined1 auVar12 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_79;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_78;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48._0_4_ = this->output_width;
  local_48._4_4_ = this->output_height;
  auVar12._0_4_ = -(uint)((undefined4)local_48 == 0);
  auVar12._4_4_ = -(uint)((undefined4)local_48 == 0);
  auVar12._8_4_ = -(uint)(local_48._4_4_ == 0);
  auVar12._12_4_ = -(uint)(local_48._4_4_ == 0);
  iVar10 = movmskpd(in_EAX,auVar12);
  if (iVar10 != 0) {
    uVar13 = (uint)(bottom_blob->dims == 1);
    uVar1 = bottom_blob->w;
    uVar3 = bottom_blob->h;
    uVar11 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar13 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar2 = this->width_scale;
    uVar4 = this->height_scale;
    local_48 = CONCAT44((int)((float)uVar4 *
                             (float)(uVar13 & 0x3f800000 | ~uVar13 & (uint)(float)(int)uVar3)),
                        (int)((float)uVar2 *
                             (float)(uVar11 & 0x3f800000 | ~uVar11 & (uint)(float)(int)uVar1)));
  }
  uStack_40 = 0;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&local_60,2,(allocator_type *)&local_78);
  pMVar6 = local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != bottom_blob) {
    piVar5 = bottom_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if ((local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar6->cstep = 0;
    pMVar6->data = (void *)0x0;
    pMVar6->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar6->refcount + 4) = (undefined1  [16])0x0;
    pMVar6->dims = 0;
    pMVar6->w = 0;
    pMVar6->h = 0;
    pMVar6->d = 0;
    pMVar6->c = 0;
    piVar5 = bottom_blob->refcount;
    pMVar6->data = bottom_blob->data;
    pMVar6->refcount = piVar5;
    pMVar6->elemsize = bottom_blob->elemsize;
    pMVar6->elempack = bottom_blob->elempack;
    pMVar6->allocator = bottom_blob->allocator;
    iVar10 = bottom_blob->w;
    iVar7 = bottom_blob->h;
    iVar8 = bottom_blob->d;
    pMVar6->dims = bottom_blob->dims;
    pMVar6->w = iVar10;
    pMVar6->h = iVar7;
    pMVar6->d = iVar8;
    pMVar6->c = bottom_blob->c;
    pMVar6->cstep = bottom_blob->cstep;
  }
  piVar5 = local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start[1].refcount;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
        if (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].data != (void *)0x0) {
          free(local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].data);
        }
      }
      else {
        (*(local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].cstep = 0;
  *(undefined1 (*) [16])
   ((long)&local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start[1].refcount + 4) = (undefined1  [16])0x0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].data = (void *)0x0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].refcount = (int *)0x0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].w = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].h = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].d = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].c = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].allocator = (Allocator *)0x0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].dims = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].w = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].w = (undefined4)local_48;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].h = local_48._4_4_;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].d = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].c = 0;
  local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start[1].cstep = 0;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_78,1,&local_79);
  iVar10 = (*(this->super_Layer)._vptr_Layer[6])(this,&local_60,&local_78,opt);
  if (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != top_blob) {
    piVar5 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar5 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    top_blob->data =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->data;
    top_blob->refcount = piVar5;
    top_blob->elemsize =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elemsize;
    top_blob->elempack =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elempack;
    top_blob->allocator =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->allocator;
    iVar7 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->w;
    iVar8 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->h;
    iVar9 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->d;
    top_blob->dims =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->dims;
    top_blob->w = iVar7;
    top_blob->h = iVar8;
    top_blob->d = iVar9;
    top_blob->c = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->c;
    top_blob->cstep =
         (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_78);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_60);
  return iVar10;
}

Assistant:

int Interp::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    int outw = output_width;
    int outh = output_height;
    if (bottom_blob.dims == 1)
    {
        w = 1;
        h = 1;
    }
    if (outw == 0 || outh == 0)
    {
        outw = static_cast<int>(w * width_scale);
        outh = static_cast<int>(h * height_scale);
    }

    Mat reference_blob;
    reference_blob.w = outw;
    reference_blob.h = outh;

    std::vector<Mat> bottom_blobs(2);
    bottom_blobs[0] = bottom_blob;
    bottom_blobs[1] = reference_blob;

    std::vector<Mat> top_blobs(1);

    int ret = forward(bottom_blobs, top_blobs, opt);

    top_blob = top_blobs[0];

    return ret;
}